

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

bool __thiscall
cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(cmNinjaTargetGenerator *this,cmNinjaVars *vars)

{
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar1;
  TargetType TVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  cmTarget *this_01;
  bool bVar5;
  allocator local_c9;
  string local_c8;
  string local_a8;
  string compilePdbPath;
  string pdbPath;
  key_type local_48;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string((string *)&pdbPath,"MSVC_C_ARCHITECTURE_ID",(allocator *)&local_c8);
  pcVar3 = cmMakefile::GetDefinition(this_00,&pdbPath);
  bVar5 = true;
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&compilePdbPath,"MSVC_CXX_ARCHITECTURE_ID",(allocator *)&local_a8);
    pcVar3 = cmMakefile::GetDefinition(this_00,&compilePdbPath);
    bVar5 = pcVar3 != (char *)0x0;
    std::__cxx11::string::~string((string *)&compilePdbPath);
  }
  std::__cxx11::string::~string((string *)&pdbPath);
  if (bVar5 != false) {
    pdbPath._M_dataplus._M_p = (pointer)&pdbPath.field_2;
    pdbPath._M_string_length = 0;
    pdbPath.field_2._M_local_buf[0] = '\0';
    compilePdbPath._M_dataplus._M_p = (pointer)&compilePdbPath.field_2;
    compilePdbPath._M_string_length = 0;
    compilePdbPath.field_2._M_local_buf[0] = '\0';
    this_01 = this->Target;
    TVar2 = this_01->TargetTypeValue;
    if (TVar2 < OBJECT_LIBRARY) {
      cmTarget::GetPDBDirectory(&local_c8,this_01,&this->LocalGenerator->ConfigName);
      std::__cxx11::string::operator=((string *)&pdbPath,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::append((char *)&pdbPath);
      cmTarget::GetPDBName(&local_c8,this->Target,&this->LocalGenerator->ConfigName);
      std::__cxx11::string::append((string *)&pdbPath);
      std::__cxx11::string::~string((string *)&local_c8);
      this_01 = this->Target;
      TVar2 = this_01->TargetTypeValue;
    }
    if ((int)TVar2 < 5) {
      cmTarget::GetCompilePDBPath(&local_c8,this_01,&this->LocalGenerator->ConfigName);
      std::__cxx11::string::operator=((string *)&compilePdbPath,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      if (compilePdbPath._M_string_length == 0) {
        cmTarget::GetSupportDirectory_abi_cxx11_(&local_a8,this->Target);
        std::operator+(&local_c8,&local_a8,"/");
        std::__cxx11::string::operator=((string *)&compilePdbPath,(string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_a8);
      }
    }
    pcVar1 = this->LocalGenerator;
    ConvertToNinjaPath(&local_a8,this,&pdbPath);
    cmOutputConverter::ConvertToOutputFormat
              (&local_c8,&(pcVar1->super_cmLocalGenerator).super_cmOutputConverter,&local_a8,SHELL);
    std::__cxx11::string::string((string *)&local_48,"TARGET_PDB",&local_c9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_48);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    pcVar1 = this->LocalGenerator;
    ConvertToNinjaPath(&local_a8,this,&compilePdbPath);
    cmOutputConverter::ConvertToOutputFormat
              (&local_c8,&(pcVar1->super_cmLocalGenerator).super_cmOutputConverter,&local_a8,SHELL);
    std::__cxx11::string::string((string *)&local_48,"TARGET_COMPILE_PDB",&local_c9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_48);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    EnsureParentDirectoryExists(this,&pdbPath);
    EnsureParentDirectoryExists(this,&compilePdbPath);
    std::__cxx11::string::~string((string *)&compilePdbPath);
    std::__cxx11::string::~string((string *)&pdbPath);
  }
  return bVar5;
}

Assistant:

bool cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(cmNinjaVars& vars) const
{
  cmMakefile* mf = this->GetMakefile();
  if (mf->GetDefinition("MSVC_C_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CXX_ARCHITECTURE_ID"))
    {
    std::string pdbPath;
    std::string compilePdbPath;
    if(this->Target->GetType() == cmTarget::EXECUTABLE ||
       this->Target->GetType() == cmTarget::STATIC_LIBRARY ||
       this->Target->GetType() == cmTarget::SHARED_LIBRARY ||
       this->Target->GetType() == cmTarget::MODULE_LIBRARY)
      {
      pdbPath = this->Target->GetPDBDirectory(this->GetConfigName());
      pdbPath += "/";
      pdbPath += this->Target->GetPDBName(this->GetConfigName());
      }
    if(this->Target->GetType() <= cmTarget::OBJECT_LIBRARY)
      {
      compilePdbPath = this->Target->GetCompilePDBPath(this->GetConfigName());
      if(compilePdbPath.empty())
        {
        compilePdbPath = this->Target->GetSupportDirectory() + "/";
        }
      }

    vars["TARGET_PDB"] = this->GetLocalGenerator()->ConvertToOutputFormat(
                          ConvertToNinjaPath(pdbPath),
                          cmLocalGenerator::SHELL);
    vars["TARGET_COMPILE_PDB"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        ConvertToNinjaPath(compilePdbPath),
        cmLocalGenerator::SHELL);

    EnsureParentDirectoryExists(pdbPath);
    EnsureParentDirectoryExists(compilePdbPath);
    return true;
    }
  return false;
}